

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O0

void writeInitialLength(InitialLength *Length,raw_ostream *OS,bool IsLittleEndian)

{
  bool bVar1;
  bool IsLittleEndian_local;
  raw_ostream *OS_local;
  InitialLength *Length_local;
  
  writeInteger<unsigned_int>(Length->TotalLength,OS,IsLittleEndian);
  bVar1 = llvm::DWARFYAML::InitialLength::isDWARF64(Length);
  if (bVar1) {
    writeInteger<unsigned_long>(Length->TotalLength64,OS,IsLittleEndian);
  }
  return;
}

Assistant:

static void writeInitialLength(const DWARFYAML::InitialLength &Length,
                               raw_ostream &OS, bool IsLittleEndian) {
  writeInteger((uint32_t)Length.TotalLength, OS, IsLittleEndian);
  if (Length.isDWARF64())
    writeInteger((uint64_t)Length.TotalLength64, OS, IsLittleEndian);
}